

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void * la_xrealloc(void *ptr,size_t size,char *file,int line,char *func)

{
  byte *pbVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  void *pvVar5;
  size_t sVar6;
  void *pvVar7;
  byte bVar8;
  void *extraout_RDX;
  long *plVar9;
  ulong uVar10;
  
  pvVar5 = realloc(ptr,size);
  if (pvVar5 != (void *)0x0) {
    return pvVar5;
  }
  plVar9 = (long *)(ulong)(uint)line;
  la_xrealloc_cold_1();
  if ((file == (char *)0x0) || (sVar6 = strlen(file), sVar6 < 2)) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = (void *)(sVar6 >> 1);
    pvVar7 = la_xcalloc((size_t)pvVar5,1,
                        "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/util.c"
                        ,0x3d,"la_slurp_hexstring");
    *plVar9 = (long)pvVar7;
    if ((sVar6 & 0xfffffffffffffffe) != 0) {
      bVar4 = 0;
      uVar10 = 0;
      pvVar7 = extraout_RDX;
      do {
        cVar2 = file[uVar10];
        bVar8 = cVar2 - 0x30;
        if (bVar8 < 10) {
LAB_00157e10:
          pbVar1 = (byte *)(*plVar9 + (uVar10 >> 1));
          *pbVar1 = *pbVar1 | bVar8 << (~bVar4 & 4);
          bVar3 = true;
        }
        else {
          if ((byte)(cVar2 + 0xbfU) < 6) {
            bVar8 = cVar2 - 0x37;
            goto LAB_00157e10;
          }
          if ((byte)(cVar2 + 0x9fU) < 6) {
            bVar8 = cVar2 + 0xa9;
            goto LAB_00157e10;
          }
          pvVar7 = (void *)(uVar10 >> 1);
          bVar3 = false;
        }
        if (!bVar3) {
          return pvVar7;
        }
        uVar10 = uVar10 + 1;
        bVar4 = bVar4 + 4;
      } while ((sVar6 & 0xfffffffffffffffe) != uVar10);
    }
  }
  return pvVar5;
}

Assistant:

void *la_xrealloc(void *ptr, size_t size, char const *file, int line, char const *func) {
	ptr = realloc(ptr, size);
	if(ptr == NULL) {
		fprintf(stderr, "%s:%d: %s(): realloc(%zu) failed: %s\n",
				file, line, func, size, strerror(errno));
		_exit(1);
	}
	return ptr;
}